

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.cpp
# Opt level: O0

ktx_error_code_e
ktxUncompressZLIBInt(uchar *pDest,ktx_size_t *pDestLength,uchar *pSrc,ktx_size_t srcLength)

{
  ulong uVar1;
  int iVar2;
  ulong in_RCX;
  ulong *in_RSI;
  int status;
  mz_ulong mzUncompressedSize;
  mz_ulong in_stack_00000040;
  uchar *in_stack_00000048;
  mz_ulong *in_stack_00000050;
  uchar *in_stack_00000058;
  undefined4 local_4;
  
  if ((in_RCX | *in_RSI) < 0x100000000) {
    uVar1 = *in_RSI;
    iVar2 = buminiz::mz_uncompress
                      (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040);
    if (iVar2 == -5) {
      local_4 = KTX_DECOMPRESS_LENGTH_ERROR;
    }
    else if (iVar2 == -4) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else if (iVar2 == 0) {
      *in_RSI = uVar1;
      local_4 = KTX_SUCCESS;
    }
    else {
      local_4 = KTX_FILE_DATA_ERROR;
    }
  }
  else {
    local_4 = KTX_INVALID_VALUE;
  }
  return local_4;
}

Assistant:

KTX_error_code ktxUncompressZLIBInt(unsigned char* pDest,
                                    ktx_size_t* pDestLength,
                                    const unsigned char* pSrc,
                                    ktx_size_t srcLength) {
    if ((srcLength | *pDestLength) > 0xFFFFFFFFU) return KTX_INVALID_VALUE;
    mz_ulong mzUncompressedSize = (mz_ulong)*pDestLength;
    int status = mz_uncompress(pDest, &mzUncompressedSize, pSrc, (mz_ulong)srcLength);
    switch (status) {
    case MZ_OK:
        *pDestLength = mzUncompressedSize;
        return KTX_SUCCESS;
    case MZ_BUF_ERROR:
        return KTX_DECOMPRESS_LENGTH_ERROR; // buffer too small
    case MZ_MEM_ERROR:
        return KTX_OUT_OF_MEMORY;
    default:
        return KTX_FILE_DATA_ERROR;
    }
}